

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

void __thiscall
vkt::BindingModel::anon_unknown_1::BufferComputeInstance::writeDescriptorSetWithTemplate
          (BufferComputeInstance *this,VkDescriptorSet descriptorSet,VkDescriptorSetLayout layout,
          VkBuffer viewA,deUint32 offsetA,VkBuffer viewB,deUint32 offsetB,VkBuffer resBuf,
          bool withPush,VkPipelineLayout pipelineLayout)

{
  RawUpdateRegistry *this_00;
  ShaderInputInterface SVar1;
  VkDescriptorUpdateTemplateKHR obj;
  VkDescriptorBufferInfo bufferInfos [2];
  VkDescriptorBufferInfo resultInfo;
  undefined1 local_118 [8];
  undefined8 uStack_110;
  VkDevice local_108;
  VkAllocationCallbacks *pVStack_100;
  VkDescriptorUpdateTemplateEntryKHR *local_f8;
  iterator iStack_f0;
  VkDescriptorUpdateTemplateEntryKHR *local_e8;
  Move<vk::Handle<(vk::HandleType)32>_> local_d8;
  VkDescriptorBufferInfo local_b8;
  VkDescriptorBufferInfo local_a0;
  VkDescriptorUpdateTemplateCreateInfoKHR local_80;
  VkDescriptorBufferInfo local_38;
  
  local_a0.offset = (VkDeviceSize)offsetB;
  local_38.buffer.m_internal = resBuf.m_internal;
  local_38.offset = 0;
  local_38.range = 0x40;
  local_b8.offset = (VkDeviceSize)offsetA;
  local_b8.range = 0x20;
  local_a0.range = 0x20;
  local_e8 = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_f8 = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  iStack_f0._M_current = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_80.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR;
  local_80.pNext = (void *)0x0;
  local_80.flags = 0;
  local_80.descriptorUpdateEntryCount = 0;
  local_80.pDescriptorUpdateEntries = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_80.templateType = (VkDescriptorUpdateTemplateTypeKHR)withPush;
  local_80.pipelineBindPoint = VK_PIPELINE_BIND_POINT_COMPUTE;
  local_80.pipelineLayout.m_internal = pipelineLayout.m_internal;
  local_80.set = 0;
  this_00 = &this->m_updateRegistry;
  local_b8.buffer.m_internal = viewA.m_internal;
  local_a0.buffer.m_internal = viewB.m_internal;
  local_80.descriptorSetLayout.m_internal = layout.m_internal;
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorBufferInfo>(this_00,&local_38);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorBufferInfo>(this_00,&local_b8);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorBufferInfo>(this_00,&local_a0);
  local_108 = (VkDevice)
              *(this->m_updateRegistry).m_updateEntryOffsets.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
  local_118._0_4_ = 0;
  local_118._4_4_ = 0;
  uStack_110._0_4_ = 1;
  uStack_110._4_4_ = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  pVStack_100 = (VkAllocationCallbacks *)0x0;
  if (iStack_f0._M_current == local_e8) {
    std::
    vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
    ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
              ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                *)&local_f8,iStack_f0,(VkDescriptorUpdateTemplateEntryKHR *)local_118);
  }
  else {
    (iStack_f0._M_current)->offset = (deUintptr)local_108;
    (iStack_f0._M_current)->stride = 0;
    (iStack_f0._M_current)->dstBinding = 0;
    (iStack_f0._M_current)->dstArrayElement = 0;
    (iStack_f0._M_current)->descriptorCount = 1;
    (iStack_f0._M_current)->descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
    iStack_f0._M_current = iStack_f0._M_current + 1;
  }
  SVar1 = this->m_shaderInterface;
  if (SVar1 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    local_108 = (VkDevice)
                (this->m_updateRegistry).m_updateEntryOffsets.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[1];
    local_118._0_4_ = 1;
    local_118._4_4_ = 0;
    uStack_110._4_4_ = this->m_descriptorType;
    uStack_110._0_4_ = 1;
    pVStack_100 = (VkAllocationCallbacks *)0x0;
    if (iStack_f0._M_current == local_e8) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_f8,iStack_f0,(VkDescriptorUpdateTemplateEntryKHR *)local_118);
      goto LAB_00530025;
    }
  }
  else if (SVar1 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    uStack_110._4_4_ = this->m_descriptorType;
    local_108 = (VkDevice)
                (this->m_updateRegistry).m_updateEntryOffsets.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[1];
    local_118._0_4_ = 1;
    local_118._4_4_ = 0;
    uStack_110._0_4_ = 1;
    pVStack_100 = (VkAllocationCallbacks *)0x0;
    if (iStack_f0._M_current == local_e8) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_f8,iStack_f0,(VkDescriptorUpdateTemplateEntryKHR *)local_118);
    }
    else {
      (iStack_f0._M_current)->offset = (deUintptr)local_108;
      (iStack_f0._M_current)->stride = 0;
      (iStack_f0._M_current)->dstBinding = 1;
      (iStack_f0._M_current)->dstArrayElement = 0;
      (iStack_f0._M_current)->descriptorCount = 1;
      (iStack_f0._M_current)->descriptorType = uStack_110._4_4_;
      iStack_f0._M_current = iStack_f0._M_current + 1;
    }
    local_108 = (VkDevice)
                (this->m_updateRegistry).m_updateEntryOffsets.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[2];
    local_118._0_4_ = 2;
    local_118._4_4_ = 0;
    uStack_110._4_4_ = this->m_descriptorType;
    uStack_110._0_4_ = 1;
    pVStack_100 = (VkAllocationCallbacks *)0x0;
    if (iStack_f0._M_current == local_e8) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_f8,iStack_f0,(VkDescriptorUpdateTemplateEntryKHR *)local_118);
      goto LAB_00530025;
    }
  }
  else {
    if (SVar1 != SHADER_INPUT_DESCRIPTOR_ARRAY) goto LAB_00530025;
    local_108 = (VkDevice)
                (this->m_updateRegistry).m_updateEntryOffsets.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[1];
    local_118._0_4_ = 1;
    local_118._4_4_ = 0;
    uStack_110._4_4_ = this->m_descriptorType;
    uStack_110._0_4_ = 2;
    pVStack_100 = (VkAllocationCallbacks *)0x18;
    if (iStack_f0._M_current == local_e8) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_f8,iStack_f0,(VkDescriptorUpdateTemplateEntryKHR *)local_118);
      goto LAB_00530025;
    }
  }
  (iStack_f0._M_current)->offset = (deUintptr)local_108;
  (iStack_f0._M_current)->stride = (deUintptr)pVStack_100;
  (iStack_f0._M_current)->dstBinding = local_118._0_4_;
  (iStack_f0._M_current)->dstArrayElement = local_118._4_4_;
  (iStack_f0._M_current)->descriptorCount = (deUint32)uStack_110;
  (iStack_f0._M_current)->descriptorType = uStack_110._4_4_;
  iStack_f0._M_current = iStack_f0._M_current + 1;
LAB_00530025:
  local_80.pDescriptorUpdateEntries = local_f8;
  local_80.descriptorUpdateEntryCount =
       (deUint32)((ulong)((long)iStack_f0._M_current - (long)local_f8) >> 5);
  ::vk::createDescriptorUpdateTemplateKHR
            (&local_d8,this->m_vki,this->m_device,&local_80,(VkAllocationCallbacks *)0x0);
  local_108 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_device;
  pVStack_100 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_allocator;
  local_118 = (undefined1  [8])
              local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal;
  uStack_110 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_deviceIface;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal = 0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.
       m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)32>_>::operator()
              (&(this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.
                deleter,obj);
  }
  (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_device =
       local_108;
  (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_allocator
       = pVStack_100;
  *(undefined4 *)
   &(this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal
       = local_118._0_4_;
  *(undefined4 *)
   ((long)&(this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.
           m_internal + 4) = local_118._4_4_;
  *(deUint32 *)
   &(this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.
    m_deviceIface = (deUint32)uStack_110;
  *(VkDescriptorType *)
   ((long)&(this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.
           m_deviceIface + 4) = uStack_110._4_4_;
  if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)32>_>::operator()
              (&local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter,
               (VkDescriptorUpdateTemplateKHR)
               local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal);
  }
  if (!withPush) {
    (*this->m_vki->_vptr_DeviceInterface[0x92])
              (this->m_vki,this->m_device,descriptorSet.m_internal,
               (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object
               .m_internal,
               (this->m_updateRegistry).m_updateEntries.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  if (local_f8 != (VkDescriptorUpdateTemplateEntryKHR *)0x0) {
    operator_delete(local_f8,(long)local_e8 - (long)local_f8);
  }
  return;
}

Assistant:

void BufferComputeInstance::writeDescriptorSetWithTemplate (vk::VkDescriptorSet descriptorSet, vk::VkDescriptorSetLayout layout, vk::VkBuffer viewA, deUint32 offsetA, vk::VkBuffer viewB, deUint32 offsetB, vk::VkBuffer resBuf, bool withPush, vk::VkPipelineLayout pipelineLayout)
{
	const vk::VkDescriptorBufferInfo						resultInfo			= vk::makeDescriptorBufferInfo(resBuf, 0u, (vk::VkDeviceSize)ComputeInstanceResultBuffer::DATA_SIZE);
	const vk::VkDescriptorBufferInfo						bufferInfos[2]		=
	{
		vk::makeDescriptorBufferInfo(viewA, (vk::VkDeviceSize)offsetA, (vk::VkDeviceSize)sizeof(tcu::Vec4[2])),
		vk::makeDescriptorBufferInfo(viewB, (vk::VkDeviceSize)offsetB, (vk::VkDeviceSize)sizeof(tcu::Vec4[2])),
	};
	std::vector<vk::VkDescriptorUpdateTemplateEntryKHR>		updateEntries;
	vk::VkDescriptorUpdateTemplateCreateInfoKHR				templateCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR,
		DE_NULL,
		0,
		0,			// descriptorUpdateEntryCount
		DE_NULL,	// pDescriptorUpdateEntries
		withPush ? vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_PUSH_DESCRIPTORS_KHR : vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_DESCRIPTOR_SET_KHR,
		layout,
		vk::VK_PIPELINE_BIND_POINT_COMPUTE,
		pipelineLayout,
		0
	};
	m_updateRegistry.addWriteObject(resultInfo);
	m_updateRegistry.addWriteObject(bufferInfos[0]);
	m_updateRegistry.addWriteObject(bufferInfos[1]);

	// result
	updateEntries.push_back(createTemplateBinding(0, 0, 1, vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, m_updateRegistry.getWriteObjectOffset(0), 0));

	// buffers
	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			updateEntries.push_back(createTemplateBinding(1, 0, 1, m_descriptorType, m_updateRegistry.getWriteObjectOffset(1), 0));
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			updateEntries.push_back(createTemplateBinding(1, 0, 1, m_descriptorType, m_updateRegistry.getWriteObjectOffset(1), 0));
			updateEntries.push_back(createTemplateBinding(2, 0, 1, m_descriptorType, m_updateRegistry.getWriteObjectOffset(2), 0));
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			updateEntries.push_back(createTemplateBinding(1, 0, 2, m_descriptorType, m_updateRegistry.getWriteObjectOffset(1), sizeof(bufferInfos[0])));
			break;

		default:
			DE_FATAL("Impossible");
	}

	templateCreateInfo.pDescriptorUpdateEntries			= &updateEntries[0];
	templateCreateInfo.descriptorUpdateEntryCount		= (deUint32)updateEntries.size();

	m_updateTemplate									= vk::createDescriptorUpdateTemplateKHR(m_vki, m_device, &templateCreateInfo);

	if (!withPush)
	{
		m_vki.updateDescriptorSetWithTemplateKHR(m_device, descriptorSet, *m_updateTemplate, m_updateRegistry.getRawPointer());
	}
}